

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O0

void __thiscall
CUI::DoLabel(CUI *this,CUIRect *pRect,char *pText,float FontSize,int Align,float LineWidth,
            bool MultiLine)

{
  int iVar1;
  ITextRender *pIVar2;
  undefined8 in_RDX;
  CUI *in_RDI;
  byte in_R8B;
  float in_XMM0_Da;
  float in_XMM1_Da;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  CTextCursor *in_stack_ffffffffffffffc8;
  CUI *in_stack_ffffffffffffffd0;
  
  if (DoLabel(CUIRect_const*,char_const*,float,int,float,bool)::s_Cursor == '\0') {
    iVar1 = __cxa_guard_acquire(&DoLabel(CUIRect_const*,char_const*,float,int,float,bool)::s_Cursor)
    ;
    if (iVar1 != 0) {
      CTextCursor::CTextCursor((CTextCursor *)in_stack_ffffffffffffffd0);
      __cxa_atexit(CTextCursor::~CTextCursor,&DoLabel::s_Cursor,&__dso_handle);
      __cxa_guard_release(&DoLabel(CUIRect_const*,char_const*,float,int,float,bool)::s_Cursor);
    }
  }
  CTextCursor::Reset((CTextCursor *)in_RDI,
                     CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  DoLabel::s_Cursor.m_MaxLines = 1;
  if ((in_R8B & 1) != 0) {
    DoLabel::s_Cursor.m_MaxLines = -1;
  }
  DoLabel::s_Cursor.m_Flags = 0;
  if ((in_R8B & 1) != 0) {
    DoLabel::s_Cursor.m_Flags = 8;
  }
  DoLabel::s_Cursor.m_FontSize = in_XMM0_Da;
  DoLabel::s_Cursor.m_MaxWidth = in_XMM1_Da;
  ApplyCursorAlign(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(CUIRect *)in_RDI,
                   in_stack_ffffffffffffffbc);
  pIVar2 = TextRender(in_RDI);
  (*(pIVar2->super_IInterface)._vptr_IInterface[0xb])(pIVar2,&DoLabel::s_Cursor,in_RDX,0xffffffff);
  return;
}

Assistant:

void CUI::DoLabel(const CUIRect *pRect, const char *pText, float FontSize, int Align, float LineWidth, bool MultiLine)
{
	// TODO: FIX ME!!!!
	// Graphics()->BlendNormal();

	static CTextCursor s_Cursor;
	s_Cursor.Reset();
	s_Cursor.m_FontSize = FontSize;
	s_Cursor.m_MaxLines = MultiLine ? -1 : 1;
	s_Cursor.m_MaxWidth = LineWidth;
	s_Cursor.m_Flags = MultiLine ? TEXTFLAG_WORD_WRAP : 0;
	ApplyCursorAlign(&s_Cursor, pRect, Align);

	TextRender()->TextOutlined(&s_Cursor, pText, -1);
}